

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmGhsMultiTargetGenerator::WriteSourceProperty
          (cmGhsMultiTargetGenerator *this,ostream *fout,cmSourceFile *sf,string *propName,
          string *propFlag)

{
  cmValue cVar1;
  ostream *poVar2;
  string *p;
  pointer pbVar3;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  char local_49;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  cVar1 = cmSourceFile::GetProperty(sf,propName);
  if (cVar1.Value != (string *)0x0) {
    arg._M_str = ((cVar1.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar1.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_(&local_48,arg,false);
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar3 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(fout,"    ",4);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (fout,(propFlag->_M_dataplus)._M_p,propFlag->_M_string_length);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length);
        local_49 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_49,1);
        pbVar3 = pbVar3 + 1;
      } while (pbVar3 != local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteSourceProperty(
  std::ostream& fout, const cmSourceFile* sf, std::string const& propName,
  std::string const& propFlag)
{
  cmValue prop = sf->GetProperty(propName);
  if (prop) {
    std::vector<std::string> list = cmExpandedList(*prop);
    for (const std::string& p : list) {
      fout << "    " << propFlag << p << '\n';
    }
  }
}